

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  RTCFilterFunctionN p_Var1;
  undefined1 auVar2 [32];
  Intersectors *pIVar3;
  ulong uVar4;
  undefined1 auVar5 [32];
  undefined1 (*pauVar6) [16];
  int iVar7;
  AABBNodeMB4D *node1;
  ulong uVar8;
  Geometry *pGVar9;
  long lVar10;
  ulong uVar11;
  undefined4 uVar12;
  ulong uVar13;
  ulong uVar14;
  Geometry *pGVar15;
  undefined1 (*pauVar16) [16];
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  vint4 bi_1;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar38;
  float fVar43;
  float fVar44;
  vint4 bi;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar45;
  undefined1 auVar41 [16];
  vint4 ai;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  uint uVar53;
  undefined1 auVar54 [16];
  uint uVar56;
  uint uVar57;
  uint uVar58;
  undefined1 auVar55 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_12e0 [16];
  long local_12d0;
  Intersectors *local_12c8;
  ulong local_12c0;
  ulong local_12b8;
  ulong local_12b0;
  undefined1 (*local_12a8) [16];
  Scene *local_12a0;
  ulong local_1298;
  RTCFilterFunctionNArguments local_1290;
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1210 [16];
  float local_1200 [4];
  float local_11f0 [4];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1170 [16];
  undefined1 local_1160 [16];
  undefined1 local_1150 [16];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar37 [32];
  undefined1 auVar42 [32];
  
  pauVar16 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar38 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar73 = ZEXT1664(CONCAT412(fVar38,CONCAT48(fVar38,CONCAT44(fVar38,fVar38))));
  fVar43 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1100._4_4_ = fVar43;
  local_1100._0_4_ = fVar43;
  local_1100._8_4_ = fVar43;
  local_1100._12_4_ = fVar43;
  auVar50 = ZEXT1664(local_1100);
  fVar38 = fVar38 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar44 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1110._4_4_ = fVar44;
  local_1110._0_4_ = fVar44;
  local_1110._8_4_ = fVar44;
  local_1110._12_4_ = fVar44;
  auVar52 = ZEXT1664(local_1110);
  fVar43 = fVar43 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar44 = fVar44 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar11 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar18 = uVar17 ^ 0x10;
  uVar20 = uVar11 ^ 0x10;
  local_1298 = uVar14 ^ 0x10;
  iVar7 = (tray->tfar).field_0.i[k];
  auVar27 = ZEXT1664(CONCAT412(iVar7,CONCAT48(iVar7,CONCAT44(iVar7,iVar7))));
  local_10f0._8_4_ = 0x80000000;
  local_10f0._0_8_ = 0x8000000080000000;
  local_10f0._12_4_ = 0x80000000;
  local_1120._0_8_ = CONCAT44(fVar38,fVar38) ^ 0x8000000080000000;
  local_1120._8_4_ = -fVar38;
  local_1120._12_4_ = -fVar38;
  auVar55 = ZEXT1664(local_1120);
  local_1130._0_8_ = CONCAT44(fVar43,fVar43) ^ 0x8000000080000000;
  local_1130._8_4_ = -fVar43;
  local_1130._12_4_ = -fVar43;
  auVar60 = ZEXT1664(local_1130);
  iVar7 = (tray->tnear).field_0.i[k];
  local_1140._4_4_ = iVar7;
  local_1140._0_4_ = iVar7;
  local_1140._8_4_ = iVar7;
  local_1140._12_4_ = iVar7;
  auVar63 = ZEXT1664(local_1140);
  local_1150._0_8_ = CONCAT44(fVar44,fVar44) ^ 0x8000000080000000;
  local_1150._8_4_ = -fVar44;
  local_1150._12_4_ = -fVar44;
  auVar66 = ZEXT1664(local_1150);
  iVar7 = 1 << ((uint)k & 0x1f);
  auVar26._4_4_ = iVar7;
  auVar26._0_4_ = iVar7;
  auVar26._8_4_ = iVar7;
  auVar26._12_4_ = iVar7;
  auVar26._16_4_ = iVar7;
  auVar26._20_4_ = iVar7;
  auVar26._24_4_ = iVar7;
  auVar26._28_4_ = iVar7;
  auVar37 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar26 = vpand_avx2(auVar26,auVar37);
  local_10e0 = vpcmpeqd_avx2(auVar26,auVar37);
  do {
    do {
      do {
        if (pauVar16 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar6 = pauVar16 + -1;
        pauVar16 = pauVar16 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar6 + 8));
      uVar22 = *(ulong *)*pauVar16;
      do {
        if ((uVar22 & 8) == 0) {
          uVar8 = uVar22 & 0xfffffffffffffff0;
          uVar12 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar28._4_4_ = uVar12;
          auVar28._0_4_ = uVar12;
          auVar28._8_4_ = uVar12;
          auVar28._12_4_ = uVar12;
          auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar8 + 0x80 + uVar17),auVar28,
                                    *(undefined1 (*) [16])(uVar8 + 0x20 + uVar17));
          auVar30 = vfmadd213ps_fma(auVar30,auVar73._0_16_,auVar55._0_16_);
          auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar8 + 0x80 + uVar11),auVar28,
                                    *(undefined1 (*) [16])(uVar8 + 0x20 + uVar11));
          auVar29 = vfmadd213ps_fma(auVar29,auVar50._0_16_,auVar60._0_16_);
          auVar30 = vpmaxsd_avx(auVar30,auVar29);
          auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar8 + 0x80 + uVar14),auVar28,
                                    *(undefined1 (*) [16])(uVar8 + 0x20 + uVar14));
          auVar29 = vfmadd213ps_fma(auVar29,auVar52._0_16_,auVar66._0_16_);
          auVar29 = vpmaxsd_avx(auVar29,auVar63._0_16_);
          auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar8 + 0x80 + uVar18),auVar28,
                                    *(undefined1 (*) [16])(uVar8 + 0x20 + uVar18));
          auVar30 = vpmaxsd_avx(auVar30,auVar29);
          auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar8 + 0x80 + uVar20),auVar28,
                                    *(undefined1 (*) [16])(uVar8 + 0x20 + uVar20));
          auVar39 = vfmadd213ps_fma(auVar39,auVar73._0_16_,auVar55._0_16_);
          auVar29 = vfmadd213ps_fma(auVar29,auVar50._0_16_,auVar60._0_16_);
          auVar29 = vpminsd_avx(auVar39,auVar29);
          auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar8 + 0x80 + local_1298),auVar28,
                                    *(undefined1 (*) [16])(uVar8 + 0x20 + local_1298));
          auVar39 = vfmadd213ps_fma(auVar39,auVar52._0_16_,auVar66._0_16_);
          auVar39 = vpminsd_avx(auVar39,auVar27._0_16_);
          auVar29 = vpminsd_avx(auVar29,auVar39);
          if (((uint)uVar22 & 7) == 6) {
            auVar39 = vcmpps_avx(auVar30,auVar29,2);
            auVar29 = vcmpps_avx(*(undefined1 (*) [16])(uVar8 + 0xe0),auVar28,2);
            auVar28 = vcmpps_avx(auVar28,*(undefined1 (*) [16])(uVar8 + 0xf0),1);
            auVar29 = vandps_avx(auVar29,auVar28);
            auVar29 = vandps_avx(auVar29,auVar39);
          }
          else {
            auVar29 = vcmpps_avx(auVar30,auVar29,2);
          }
          auVar29 = vpslld_avx(auVar29,0x1f);
          uVar12 = vmovmskps_avx(auVar29);
          This = (Intersectors *)CONCAT44((int)((ulong)This >> 0x20),uVar12);
          local_10c0[0] = (RTCHitN)auVar30[0];
          local_10c0[1] = (RTCHitN)auVar30[1];
          local_10c0[2] = (RTCHitN)auVar30[2];
          local_10c0[3] = (RTCHitN)auVar30[3];
          local_10c0[4] = (RTCHitN)auVar30[4];
          local_10c0[5] = (RTCHitN)auVar30[5];
          local_10c0[6] = (RTCHitN)auVar30[6];
          local_10c0[7] = (RTCHitN)auVar30[7];
          local_10c0[8] = (RTCHitN)auVar30[8];
          local_10c0[9] = (RTCHitN)auVar30[9];
          local_10c0[10] = (RTCHitN)auVar30[10];
          local_10c0[0xb] = (RTCHitN)auVar30[0xb];
          local_10c0[0xc] = (RTCHitN)auVar30[0xc];
          local_10c0[0xd] = (RTCHitN)auVar30[0xd];
          local_10c0[0xe] = (RTCHitN)auVar30[0xe];
          local_10c0[0xf] = (RTCHitN)auVar30[0xf];
        }
        if ((uVar22 & 8) == 0) {
          if (This == (Intersectors *)0x0) {
            iVar7 = 4;
          }
          else {
            uVar8 = uVar22 & 0xfffffffffffffff0;
            lVar10 = 0;
            for (pIVar3 = This; ((ulong)pIVar3 & 1) == 0;
                pIVar3 = (Intersectors *)((ulong)pIVar3 >> 1 | 0x8000000000000000)) {
              lVar10 = lVar10 + 1;
            }
            iVar7 = 0;
            uVar13 = (ulong)((long)&This[-1].intersector16_nofilter.name + 7U) & (ulong)This;
            uVar22 = *(ulong *)(uVar8 + lVar10 * 8);
            if (uVar13 != 0) {
              uVar53 = *(uint *)(local_10c0 + lVar10 * 4);
              lVar10 = 0;
              for (uVar4 = uVar13; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x8000000000000000) {
                lVar10 = lVar10 + 1;
              }
              uVar13 = uVar13 - 1 & uVar13;
              uVar4 = *(ulong *)(uVar8 + lVar10 * 8);
              uVar56 = *(uint *)(local_10c0 + lVar10 * 4);
              if (uVar13 == 0) {
                if (uVar53 < uVar56) {
                  *(ulong *)*pauVar16 = uVar4;
                  *(uint *)(*pauVar16 + 8) = uVar56;
                  pauVar16 = pauVar16 + 1;
                }
                else {
                  *(ulong *)*pauVar16 = uVar22;
                  *(uint *)(*pauVar16 + 8) = uVar53;
                  pauVar16 = pauVar16 + 1;
                  uVar22 = uVar4;
                }
              }
              else {
                auVar30._8_8_ = 0;
                auVar30._0_8_ = uVar22;
                auVar30 = vpunpcklqdq_avx(auVar30,ZEXT416(uVar53));
                auVar29._8_8_ = 0;
                auVar29._0_8_ = uVar4;
                auVar29 = vpunpcklqdq_avx(auVar29,ZEXT416(uVar56));
                lVar10 = 0;
                for (uVar22 = uVar13; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000)
                {
                  lVar10 = lVar10 + 1;
                }
                uVar13 = uVar13 - 1 & uVar13;
                auVar39._8_8_ = 0;
                auVar39._0_8_ = *(ulong *)(uVar8 + lVar10 * 8);
                auVar28 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_10c0 + lVar10 * 4)));
                auVar39 = vpcmpgtd_avx(auVar29,auVar30);
                if (uVar13 == 0) {
                  auVar46 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar29,auVar30,auVar46);
                  auVar30 = vblendvps_avx(auVar30,auVar29,auVar46);
                  auVar29 = vpcmpgtd_avx(auVar28,auVar39);
                  auVar46 = vpshufd_avx(auVar29,0xaa);
                  auVar29 = vblendvps_avx(auVar28,auVar39,auVar46);
                  auVar39 = vblendvps_avx(auVar39,auVar28,auVar46);
                  auVar28 = vpcmpgtd_avx(auVar39,auVar30);
                  auVar46 = vpshufd_avx(auVar28,0xaa);
                  auVar28 = vblendvps_avx(auVar39,auVar30,auVar46);
                  auVar30 = vblendvps_avx(auVar30,auVar39,auVar46);
                  *pauVar16 = auVar30;
                  pauVar16[1] = auVar28;
                  uVar22 = auVar29._0_8_;
                  pauVar16 = pauVar16 + 2;
                }
                else {
                  lVar10 = 0;
                  for (; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                    lVar10 = lVar10 + 1;
                  }
                  auVar46._8_8_ = 0;
                  auVar46._0_8_ = *(ulong *)(uVar8 + lVar10 * 8);
                  auVar40 = vpunpcklqdq_avx(auVar46,ZEXT416(*(uint *)(local_10c0 + lVar10 * 4)));
                  auVar46 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar29,auVar30,auVar46);
                  auVar30 = vblendvps_avx(auVar30,auVar29,auVar46);
                  auVar29 = vpcmpgtd_avx(auVar40,auVar28);
                  auVar46 = vpshufd_avx(auVar29,0xaa);
                  auVar29 = vblendvps_avx(auVar40,auVar28,auVar46);
                  auVar28 = vblendvps_avx(auVar28,auVar40,auVar46);
                  auVar46 = vpcmpgtd_avx(auVar28,auVar30);
                  auVar40 = vpshufd_avx(auVar46,0xaa);
                  auVar46 = vblendvps_avx(auVar28,auVar30,auVar40);
                  auVar30 = vblendvps_avx(auVar30,auVar28,auVar40);
                  auVar28 = vpcmpgtd_avx(auVar29,auVar39);
                  auVar40 = vpshufd_avx(auVar28,0xaa);
                  auVar28 = vblendvps_avx(auVar29,auVar39,auVar40);
                  auVar29 = vblendvps_avx(auVar39,auVar29,auVar40);
                  auVar39 = vpcmpgtd_avx(auVar46,auVar29);
                  auVar40 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar46,auVar29,auVar40);
                  auVar29 = vblendvps_avx(auVar29,auVar46,auVar40);
                  *pauVar16 = auVar30;
                  pauVar16[1] = auVar29;
                  pauVar16[2] = auVar39;
                  uVar22 = auVar28._0_8_;
                  pauVar16 = pauVar16 + 3;
                }
              }
            }
          }
        }
        else {
          iVar7 = 6;
        }
      } while (iVar7 == 0);
    } while (iVar7 != 6);
    lVar10 = (ulong)((uint)uVar22 & 0xf) - 8;
    if (lVar10 != 0) {
      uVar22 = uVar22 & 0xfffffffffffffff0;
      lVar21 = 0;
      do {
        lVar19 = lVar21 * 0x140;
        uVar12 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar23._4_4_ = uVar12;
        auVar23._0_4_ = uVar12;
        auVar23._8_4_ = uVar12;
        auVar23._12_4_ = uVar12;
        auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x90 + lVar19),auVar23,
                                  *(undefined1 (*) [16])(uVar22 + lVar19));
        auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xa0 + lVar19),auVar23,
                                  *(undefined1 (*) [16])(uVar22 + 0x10 + lVar19));
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xb0 + lVar19),auVar23,
                                  *(undefined1 (*) [16])(uVar22 + 0x20 + lVar19));
        auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xc0 + lVar19),auVar23,
                                  *(undefined1 (*) [16])(uVar22 + 0x30 + lVar19));
        auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xd0 + lVar19),auVar23,
                                  *(undefined1 (*) [16])(uVar22 + 0x40 + lVar19));
        auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xe0 + lVar19),auVar23,
                                  *(undefined1 (*) [16])(uVar22 + 0x50 + lVar19));
        auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xf0 + lVar19),auVar23,
                                  *(undefined1 (*) [16])(uVar22 + 0x60 + lVar19));
        auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x100 + lVar19),auVar23,
                                  *(undefined1 (*) [16])(uVar22 + 0x70 + lVar19));
        auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x110 + lVar19),auVar23,
                                  *(undefined1 (*) [16])(uVar22 + 0x80 + lVar19));
        auVar29 = vsubps_avx(auVar35,auVar30);
        auVar30 = vsubps_avx(auVar48,auVar39);
        auVar39 = vsubps_avx(auVar32,auVar28);
        auVar28 = vsubps_avx(auVar46,auVar35);
        auVar46 = vsubps_avx(auVar40,auVar48);
        auVar40 = vsubps_avx(auVar23,auVar32);
        auVar24._0_4_ = auVar40._0_4_ * auVar30._0_4_;
        auVar24._4_4_ = auVar40._4_4_ * auVar30._4_4_;
        auVar24._8_4_ = auVar40._8_4_ * auVar30._8_4_;
        auVar24._12_4_ = auVar40._12_4_ * auVar30._12_4_;
        local_11d0 = vfmsub231ps_fma(auVar24,auVar46,auVar39);
        auVar31._0_4_ = auVar39._0_4_ * auVar28._0_4_;
        auVar31._4_4_ = auVar39._4_4_ * auVar28._4_4_;
        auVar31._8_4_ = auVar39._8_4_ * auVar28._8_4_;
        auVar31._12_4_ = auVar39._12_4_ * auVar28._12_4_;
        local_11c0 = vfmsub231ps_fma(auVar31,auVar40,auVar29);
        uVar12 = *(undefined4 *)(ray + k * 4);
        auVar64._4_4_ = uVar12;
        auVar64._0_4_ = uVar12;
        auVar64._8_4_ = uVar12;
        auVar64._12_4_ = uVar12;
        uVar12 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar67._4_4_ = uVar12;
        auVar67._0_4_ = uVar12;
        auVar67._8_4_ = uVar12;
        auVar67._12_4_ = uVar12;
        uVar12 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar70._4_4_ = uVar12;
        auVar70._0_4_ = uVar12;
        auVar70._8_4_ = uVar12;
        auVar70._12_4_ = uVar12;
        fVar38 = *(float *)(ray + k * 4 + 0x80);
        auVar59._4_4_ = fVar38;
        auVar59._0_4_ = fVar38;
        auVar59._8_4_ = fVar38;
        auVar59._12_4_ = fVar38;
        auVar35 = vsubps_avx(auVar35,auVar64);
        fVar43 = *(float *)(ray + k * 4 + 0xa0);
        auVar65._4_4_ = fVar43;
        auVar65._0_4_ = fVar43;
        auVar65._8_4_ = fVar43;
        auVar65._12_4_ = fVar43;
        auVar48 = vsubps_avx(auVar48,auVar67);
        fVar44 = *(float *)(ray + k * 4 + 0xc0);
        auVar68._4_4_ = fVar44;
        auVar68._0_4_ = fVar44;
        auVar68._8_4_ = fVar44;
        auVar68._12_4_ = fVar44;
        auVar32 = vsubps_avx(auVar32,auVar70);
        auVar71._0_4_ = fVar38 * auVar48._0_4_;
        auVar71._4_4_ = fVar38 * auVar48._4_4_;
        auVar71._8_4_ = fVar38 * auVar48._8_4_;
        auVar71._12_4_ = fVar38 * auVar48._12_4_;
        auVar23 = vfmsub231ps_fma(auVar71,auVar35,auVar65);
        auVar61._0_4_ = auVar40._0_4_ * auVar23._0_4_;
        auVar61._4_4_ = auVar40._4_4_ * auVar23._4_4_;
        auVar61._8_4_ = auVar40._8_4_ * auVar23._8_4_;
        auVar61._12_4_ = auVar40._12_4_ * auVar23._12_4_;
        auVar72._0_4_ = auVar39._0_4_ * auVar23._0_4_;
        auVar72._4_4_ = auVar39._4_4_ * auVar23._4_4_;
        auVar72._8_4_ = auVar39._8_4_ * auVar23._8_4_;
        auVar72._12_4_ = auVar39._12_4_ * auVar23._12_4_;
        auVar54._0_4_ = fVar44 * auVar35._0_4_;
        auVar54._4_4_ = fVar44 * auVar35._4_4_;
        auVar54._8_4_ = fVar44 * auVar35._8_4_;
        auVar54._12_4_ = fVar44 * auVar35._12_4_;
        auVar40 = vfmsub231ps_fma(auVar54,auVar32,auVar59);
        auVar39 = vfmadd231ps_fma(auVar61,auVar40,auVar46);
        auVar40 = vfmadd231ps_fma(auVar72,auVar30,auVar40);
        auVar51._0_4_ = auVar46._0_4_ * auVar29._0_4_;
        auVar51._4_4_ = auVar46._4_4_ * auVar29._4_4_;
        auVar51._8_4_ = auVar46._8_4_ * auVar29._8_4_;
        auVar51._12_4_ = auVar46._12_4_ * auVar29._12_4_;
        local_11b0 = vfmsub231ps_fma(auVar51,auVar28,auVar30);
        auVar49._0_4_ = fVar43 * auVar32._0_4_;
        auVar49._4_4_ = fVar43 * auVar32._4_4_;
        auVar49._8_4_ = fVar43 * auVar32._8_4_;
        auVar49._12_4_ = fVar43 * auVar32._12_4_;
        auVar23 = vfmsub231ps_fma(auVar49,auVar48,auVar68);
        auVar69._0_4_ = local_11b0._0_4_ * fVar44;
        auVar69._4_4_ = local_11b0._4_4_ * fVar44;
        auVar69._8_4_ = local_11b0._8_4_ * fVar44;
        auVar69._12_4_ = local_11b0._12_4_ * fVar44;
        auVar30 = vfmadd231ps_fma(auVar69,local_11c0,auVar65);
        auVar46 = vfmadd231ps_fma(auVar30,local_11d0,auVar59);
        auVar39 = vfmadd231ps_fma(auVar39,auVar23,auVar28);
        auVar30 = vandps_avx(auVar46,local_10f0);
        uVar53 = auVar30._0_4_;
        local_1260._0_4_ = (float)(uVar53 ^ auVar39._0_4_);
        uVar56 = auVar30._4_4_;
        local_1260._4_4_ = (float)(uVar56 ^ auVar39._4_4_);
        uVar57 = auVar30._8_4_;
        local_1260._8_4_ = (float)(uVar57 ^ auVar39._8_4_);
        uVar58 = auVar30._12_4_;
        local_1260._12_4_ = (float)(uVar58 ^ auVar39._12_4_);
        auVar30 = vfmadd231ps_fma(auVar40,auVar29,auVar23);
        local_1250._0_4_ = (float)(uVar53 ^ auVar30._0_4_);
        local_1250._4_4_ = (float)(uVar56 ^ auVar30._4_4_);
        local_1250._8_4_ = (float)(uVar57 ^ auVar30._8_4_);
        local_1250._12_4_ = (float)(uVar58 ^ auVar30._12_4_);
        auVar39 = ZEXT816(0) << 0x20;
        auVar30 = vcmpps_avx(local_1260,auVar39,5);
        auVar29 = vcmpps_avx(local_1250,auVar39,5);
        auVar30 = vandps_avx(auVar29,auVar30);
        auVar40._8_4_ = 0x7fffffff;
        auVar40._0_8_ = 0x7fffffff7fffffff;
        auVar40._12_4_ = 0x7fffffff;
        local_1230 = vandps_avx(auVar46,auVar40);
        auVar29 = vcmpps_avx(auVar46,auVar39,4);
        auVar30 = vandps_avx(auVar30,auVar29);
        auVar62._0_4_ = local_1260._0_4_ + local_1250._0_4_;
        auVar62._4_4_ = local_1260._4_4_ + local_1250._4_4_;
        auVar62._8_4_ = local_1260._8_4_ + local_1250._8_4_;
        auVar62._12_4_ = local_1260._12_4_ + local_1250._12_4_;
        auVar29 = vcmpps_avx(auVar62,local_1230,2);
        auVar39 = auVar29 & auVar30;
        if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar39[0xf] < '\0') {
          auVar30 = vandps_avx(auVar30,auVar29);
          auVar47._0_4_ = local_11b0._0_4_ * auVar32._0_4_;
          auVar47._4_4_ = local_11b0._4_4_ * auVar32._4_4_;
          auVar47._8_4_ = local_11b0._8_4_ * auVar32._8_4_;
          auVar47._12_4_ = local_11b0._12_4_ * auVar32._12_4_;
          auVar29 = vfmadd213ps_fma(auVar48,local_11c0,auVar47);
          auVar29 = vfmadd213ps_fma(auVar35,local_11d0,auVar29);
          local_1240._0_4_ = (float)(uVar53 ^ auVar29._0_4_);
          local_1240._4_4_ = (float)(uVar56 ^ auVar29._4_4_);
          local_1240._8_4_ = (float)(uVar57 ^ auVar29._8_4_);
          local_1240._12_4_ = (float)(uVar58 ^ auVar29._12_4_);
          fVar38 = *(float *)(ray + k * 4 + 0x60);
          auVar35._0_4_ = local_1230._0_4_ * fVar38;
          auVar35._4_4_ = local_1230._4_4_ * fVar38;
          auVar35._8_4_ = local_1230._8_4_ * fVar38;
          auVar35._12_4_ = local_1230._12_4_ * fVar38;
          auVar29 = vcmpps_avx(auVar35,local_1240,1);
          fVar38 = *(float *)(ray + k * 4 + 0x100);
          auVar48._0_4_ = local_1230._0_4_ * fVar38;
          auVar48._4_4_ = local_1230._4_4_ * fVar38;
          auVar48._8_4_ = local_1230._8_4_ * fVar38;
          auVar48._12_4_ = local_1230._12_4_ * fVar38;
          auVar39 = vcmpps_avx(local_1240,auVar48,2);
          auVar29 = vandps_avx(auVar29,auVar39);
          auVar39 = auVar30 & auVar29;
          if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar39[0xf] < '\0') {
            local_12e0 = vandps_avx(auVar30,auVar29);
            local_12a0 = context->scene;
            auVar30 = vrcpps_avx(local_1230);
            auVar32._8_4_ = 0x3f800000;
            auVar32._0_8_ = &DAT_3f8000003f800000;
            auVar32._12_4_ = 0x3f800000;
            auVar29 = vfnmadd213ps_fma(local_1230,auVar30,auVar32);
            auVar30 = vfmadd132ps_fma(auVar29,auVar30,auVar30);
            fVar38 = auVar30._0_4_;
            local_11e0._0_4_ = fVar38 * local_1240._0_4_;
            fVar43 = auVar30._4_4_;
            local_11e0._4_4_ = fVar43 * local_1240._4_4_;
            fVar44 = auVar30._8_4_;
            local_11e0._8_4_ = fVar44 * local_1240._8_4_;
            fVar45 = auVar30._12_4_;
            local_11e0._12_4_ = fVar45 * local_1240._12_4_;
            auVar27 = ZEXT1664(local_11e0);
            local_1200[0] = fVar38 * local_1260._0_4_;
            local_1200[1] = fVar43 * local_1260._4_4_;
            local_1200[2] = fVar44 * local_1260._8_4_;
            local_1200[3] = fVar45 * local_1260._12_4_;
            auVar33._8_4_ = 0x7f800000;
            auVar33._0_8_ = 0x7f8000007f800000;
            auVar33._12_4_ = 0x7f800000;
            auVar30 = vblendvps_avx(auVar33,local_11e0,local_12e0);
            local_11f0[0] = fVar38 * local_1250._0_4_;
            local_11f0[1] = fVar43 * local_1250._4_4_;
            local_11f0[2] = fVar44 * local_1250._8_4_;
            local_11f0[3] = fVar45 * local_1250._12_4_;
            auVar29 = vshufps_avx(auVar30,auVar30,0xb1);
            auVar29 = vminps_avx(auVar29,auVar30);
            auVar39 = vshufpd_avx(auVar29,auVar29,1);
            auVar29 = vminps_avx(auVar39,auVar29);
            auVar30 = vcmpps_avx(auVar30,auVar29,0);
            auVar39 = local_12e0 & auVar30;
            auVar29 = vpcmpeqd_avx(auVar29,auVar29);
            if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar39[0xf] < '\0') {
              auVar29 = auVar30;
            }
            lVar19 = lVar19 + uVar22;
            auVar30 = vandps_avx(local_12e0,auVar29);
            uVar12 = vmovmskps_avx(auVar30);
            pGVar15 = (Geometry *)0x0;
            for (uVar8 = CONCAT44((int)((ulong)context >> 0x20),uVar12); local_1210 = local_12e0,
                (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
              pGVar15 = (Geometry *)((long)&(pGVar15->super_RefCount)._vptr_RefCount + 1);
            }
            do {
              uVar53 = *(uint *)(lVar19 + 0x120 + (long)pGVar15 * 4);
              pGVar9 = (local_12a0->geometries).items[uVar53].ptr;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_12e0 + (long)pGVar15 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar38 = local_1200[(long)pGVar15];
                  fVar43 = local_11f0[(long)pGVar15];
                  *(undefined4 *)(ray + k * 4 + 0x100) =
                       *(undefined4 *)(local_11e0 + (long)pGVar15 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) =
                       *(undefined4 *)(local_11d0 + (long)pGVar15 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) =
                       *(undefined4 *)(local_11c0 + (long)pGVar15 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) =
                       *(undefined4 *)(local_11b0 + (long)pGVar15 * 4);
                  *(float *)(ray + k * 4 + 0x1e0) = fVar38;
                  *(float *)(ray + k * 4 + 0x200) = fVar43;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)(lVar19 + 0x130 + (long)pGVar15 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar53;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  break;
                }
                local_1170 = auVar27._0_16_;
                local_1160 = auVar73._0_16_;
                fVar38 = local_1200[(long)pGVar15];
                local_1060._4_4_ = fVar38;
                local_1060._0_4_ = fVar38;
                local_1060._8_4_ = fVar38;
                local_1060._12_4_ = fVar38;
                local_1060._16_4_ = fVar38;
                local_1060._20_4_ = fVar38;
                local_1060._24_4_ = fVar38;
                local_1060._28_4_ = fVar38;
                local_1040 = local_11f0[(long)pGVar15];
                uVar12 = *(undefined4 *)(lVar19 + 0x130 + (long)pGVar15 * 4);
                auVar41._4_4_ = uVar12;
                auVar41._0_4_ = uVar12;
                auVar41._8_4_ = uVar12;
                auVar41._12_4_ = uVar12;
                auVar42._16_4_ = uVar12;
                auVar42._0_16_ = auVar41;
                auVar42._20_4_ = uVar12;
                auVar42._24_4_ = uVar12;
                auVar42._28_4_ = uVar12;
                local_10c0._4_4_ = *(undefined4 *)(local_11d0 + (long)pGVar15 * 4);
                uVar12 = *(undefined4 *)(local_11c0 + (long)pGVar15 * 4);
                local_10a0._4_4_ = uVar12;
                local_10a0._0_4_ = uVar12;
                local_10a0._8_4_ = uVar12;
                local_10a0._12_4_ = uVar12;
                local_10a0._16_4_ = uVar12;
                local_10a0._20_4_ = uVar12;
                local_10a0._24_4_ = uVar12;
                local_10a0._28_4_ = uVar12;
                uVar12 = *(undefined4 *)(local_11b0 + (long)pGVar15 * 4);
                local_1080._4_4_ = uVar12;
                local_1080._0_4_ = uVar12;
                local_1080._8_4_ = uVar12;
                local_1080._12_4_ = uVar12;
                local_1080._16_4_ = uVar12;
                local_1080._20_4_ = uVar12;
                local_1080._24_4_ = uVar12;
                local_1080._28_4_ = uVar12;
                auVar36._4_4_ = uVar53;
                auVar36._0_4_ = uVar53;
                auVar36._8_4_ = uVar53;
                auVar36._12_4_ = uVar53;
                auVar37._16_4_ = uVar53;
                auVar37._0_16_ = auVar36;
                auVar37._20_4_ = uVar53;
                auVar37._24_4_ = uVar53;
                auVar37._28_4_ = uVar53;
                local_10c0._0_4_ = local_10c0._4_4_;
                local_10c0._8_4_ = local_10c0._4_4_;
                local_10c0._12_4_ = local_10c0._4_4_;
                local_10c0[0x10] = (RTCHitN)(char)local_10c0._4_4_;
                local_10c0[0x11] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
                local_10c0[0x12] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
                local_10c0[0x13] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
                local_10c0[0x14] = (RTCHitN)(char)local_10c0._4_4_;
                local_10c0[0x15] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
                local_10c0[0x16] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
                local_10c0[0x17] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
                local_10c0[0x18] = (RTCHitN)(char)local_10c0._4_4_;
                local_10c0[0x19] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
                local_10c0[0x1a] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
                local_10c0[0x1b] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
                local_10c0[0x1c] = (RTCHitN)(char)local_10c0._4_4_;
                local_10c0[0x1d] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
                local_10c0[0x1e] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
                local_10c0[0x1f] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
                fStack_103c = local_1040;
                fStack_1038 = local_1040;
                fStack_1034 = local_1040;
                fStack_1030 = local_1040;
                fStack_102c = local_1040;
                fStack_1028 = local_1040;
                fStack_1024 = local_1040;
                local_1020 = auVar42;
                local_1000 = auVar37;
                vpcmpeqd_avx2(local_1060,local_1060);
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) =
                     *(undefined4 *)(local_11e0 + (long)pGVar15 * 4);
                local_11a0 = local_10e0._0_8_;
                uStack_1198 = local_10e0._8_8_;
                uStack_1190 = local_10e0._16_8_;
                uStack_1188 = local_10e0._24_8_;
                local_1290.valid = (int *)&local_11a0;
                local_1290.geometryUserPtr = pGVar9->userPtr;
                local_1290.context = context->user;
                local_1290.hit = local_10c0;
                local_1290.N = 8;
                local_12d0 = lVar10;
                local_12c8 = This;
                local_12c0 = uVar14;
                local_12b8 = uVar11;
                local_12b0 = uVar17;
                local_12a8 = pauVar16;
                local_1290.ray = (RTCRayN *)ray;
                if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar37 = ZEXT1632(auVar36);
                  auVar42 = ZEXT1632(auVar41);
                  (*pGVar9->intersectionFilterN)(&local_1290);
                }
                auVar2._8_8_ = uStack_1198;
                auVar2._0_8_ = local_11a0;
                auVar2._16_8_ = uStack_1190;
                auVar2._24_8_ = uStack_1188;
                auVar2 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar2);
                auVar26 = _DAT_0205a980 & ~auVar2;
                if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar26 >> 0x7f,0) == '\0') &&
                      (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar26 >> 0xbf,0) == '\0') &&
                    (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar26[0x1f]) {
                  auVar27 = ZEXT3264(auVar2 ^ _DAT_0205a980);
                }
                else {
                  p_Var1 = context->args->filter;
                  if ((p_Var1 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar37 = ZEXT1632(auVar37._0_16_);
                    auVar42 = ZEXT1632(auVar42._0_16_);
                    (*p_Var1)(&local_1290);
                  }
                  auVar5._8_8_ = uStack_1198;
                  auVar5._0_8_ = local_11a0;
                  auVar5._16_8_ = uStack_1190;
                  auVar5._24_8_ = uStack_1188;
                  auVar2 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar5);
                  auVar26 = vpcmpeqd_avx2(auVar42,auVar42);
                  auVar27 = ZEXT3264(auVar2 ^ auVar26);
                  auVar37 = vpcmpeqd_avx2(auVar37,auVar37);
                  auVar26 = auVar26 & ~auVar2;
                  if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar26 >> 0x7f,0) != '\0') ||
                        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0xbf,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar26[0x1f] < '\0') {
                    auVar2 = auVar2 ^ auVar37;
                    auVar26 = vmaskmovps_avx(auVar2,*(undefined1 (*) [32])local_1290.hit);
                    *(undefined1 (*) [32])(local_1290.ray + 0x180) = auVar26;
                    auVar26 = vmaskmovps_avx(auVar2,*(undefined1 (*) [32])(local_1290.hit + 0x20));
                    *(undefined1 (*) [32])(local_1290.ray + 0x1a0) = auVar26;
                    auVar26 = vmaskmovps_avx(auVar2,*(undefined1 (*) [32])(local_1290.hit + 0x40));
                    *(undefined1 (*) [32])(local_1290.ray + 0x1c0) = auVar26;
                    auVar26 = vmaskmovps_avx(auVar2,*(undefined1 (*) [32])(local_1290.hit + 0x60));
                    *(undefined1 (*) [32])(local_1290.ray + 0x1e0) = auVar26;
                    auVar26 = vmaskmovps_avx(auVar2,*(undefined1 (*) [32])(local_1290.hit + 0x80));
                    *(undefined1 (*) [32])(local_1290.ray + 0x200) = auVar26;
                    auVar26 = vpmaskmovd_avx2(auVar2,*(undefined1 (*) [32])(local_1290.hit + 0xa0));
                    *(undefined1 (*) [32])(local_1290.ray + 0x220) = auVar26;
                    auVar26 = vpmaskmovd_avx2(auVar2,*(undefined1 (*) [32])(local_1290.hit + 0xc0));
                    *(undefined1 (*) [32])(local_1290.ray + 0x240) = auVar26;
                    auVar26 = vpmaskmovd_avx2(auVar2,*(undefined1 (*) [32])(local_1290.hit + 0xe0));
                    *(undefined1 (*) [32])(local_1290.ray + 0x260) = auVar26;
                    auVar26 = vpmaskmovd_avx2(auVar2,*(undefined1 (*) [32])(local_1290.hit + 0x100))
                    ;
                    *(undefined1 (*) [32])(local_1290.ray + 0x280) = auVar26;
                  }
                }
                auVar26 = auVar27._0_32_;
                if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar26 >> 0x7f,0) == '\0') &&
                      (auVar27 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                     SUB321(auVar26 >> 0xbf,0) == '\0') &&
                    (auVar27 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                    -1 < auVar27[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar12;
                }
                *(undefined4 *)(local_12e0 + (long)pGVar15 * 4) = 0;
                uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar25._4_4_ = uVar12;
                auVar25._0_4_ = uVar12;
                auVar25._8_4_ = uVar12;
                auVar25._12_4_ = uVar12;
                auVar27 = ZEXT1664(local_1170);
                auVar30 = vcmpps_avx(local_1170,auVar25,2);
                local_12e0 = vandps_avx(auVar30,local_12e0);
                auVar73 = ZEXT1664(local_1160);
                pGVar9 = pGVar15;
                lVar10 = local_12d0;
                uVar11 = local_12b8;
                This = local_12c8;
                uVar14 = local_12c0;
                pauVar16 = local_12a8;
                uVar17 = local_12b0;
              }
              if ((((local_12e0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_12e0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_12e0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_12e0[0xf]) break;
              auVar34._8_4_ = 0x7f800000;
              auVar34._0_8_ = 0x7f8000007f800000;
              auVar34._12_4_ = 0x7f800000;
              auVar30 = vblendvps_avx(auVar34,auVar27._0_16_,local_12e0);
              auVar29 = vshufps_avx(auVar30,auVar30,0xb1);
              auVar29 = vminps_avx(auVar29,auVar30);
              auVar39 = vshufpd_avx(auVar29,auVar29,1);
              auVar29 = vminps_avx(auVar39,auVar29);
              auVar29 = vcmpps_avx(auVar30,auVar29,0);
              auVar39 = local_12e0 & auVar29;
              auVar30 = local_12e0;
              if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar39[0xf] < '\0') {
                auVar30 = vandps_avx(auVar29,local_12e0);
              }
              uVar12 = vmovmskps_avx(auVar30);
              pGVar15 = (Geometry *)0x0;
              for (uVar8 = CONCAT44((int)((ulong)pGVar9 >> 0x20),uVar12); (uVar8 & 1) == 0;
                  uVar8 = uVar8 >> 1 | 0x8000000000000000) {
                pGVar15 = (Geometry *)((long)&(pGVar15->super_RefCount)._vptr_RefCount + 1);
              }
            } while( true );
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != lVar10);
    }
    uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar27 = ZEXT1664(CONCAT412(uVar12,CONCAT48(uVar12,CONCAT44(uVar12,uVar12))));
    auVar50 = ZEXT1664(local_1100);
    auVar52 = ZEXT1664(local_1110);
    auVar55 = ZEXT1664(local_1120);
    auVar60 = ZEXT1664(local_1130);
    auVar63 = ZEXT1664(local_1140);
    auVar66 = ZEXT1664(local_1150);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }